

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void chan_calc(YM2151 *PSG,uint chan)

{
  INT32 IVar1;
  uint uVar2;
  int iVar3;
  YM2151Operator *OP;
  int local_2c;
  uint local_28;
  INT32 out;
  UINT32 AM;
  uint env;
  YM2151Operator *op;
  uint chan_local;
  YM2151 *PSG_local;
  
  local_28 = 0;
  if (PSG->Muted[chan] == '\0') {
    PSG->mem = 0;
    PSG->c2 = 0;
    PSG->c1 = 0;
    PSG->m2 = 0;
    OP = PSG->oper + (chan << 2);
    *OP->mem_connect = OP->mem_value;
    if (OP->ams != 0) {
      local_28 = PSG->lfa << ((char)OP->ams - 1U & 0x1f);
    }
    uVar2 = OP->tl + OP->volume + (local_28 & OP->AMmask);
    local_2c = OP->fb_out_prev + OP->fb_out_curr;
    OP->fb_out_prev = OP->fb_out_curr;
    if (OP->connect == (INT32 *)0x0) {
      IVar1 = OP->fb_out_prev;
      PSG->c2 = IVar1;
      PSG->c1 = IVar1;
      PSG->mem = IVar1;
    }
    else {
      *OP->connect = OP->fb_out_prev;
    }
    OP->fb_out_curr = 0;
    if (uVar2 < 0x340) {
      if (OP->fb_shift == 0) {
        local_2c = 0;
      }
      iVar3 = op_calc1(OP,uVar2,local_2c << ((byte)OP->fb_shift & 0x1f));
      OP->fb_out_curr = iVar3;
    }
    uVar2 = OP[1].tl + OP[1].volume + (local_28 & OP[1].AMmask);
    if (uVar2 < 0x340) {
      iVar3 = op_calc(OP + 1,uVar2,PSG->m2);
      *OP[1].connect = iVar3 + *OP[1].connect;
    }
    uVar2 = OP[2].tl + OP[2].volume + (local_28 & OP[2].AMmask);
    if (uVar2 < 0x340) {
      iVar3 = op_calc(OP + 2,uVar2,PSG->c1);
      *OP[2].connect = iVar3 + *OP[2].connect;
    }
    uVar2 = OP[3].tl + OP[3].volume + (local_28 & OP[3].AMmask);
    if (uVar2 < 0x340) {
      iVar3 = op_calc(OP + 3,uVar2,PSG->c2);
      PSG->chanout[chan] = iVar3 + PSG->chanout[chan];
    }
    OP->mem_value = PSG->mem;
  }
  return;
}

Assistant:

INLINE void chan_calc(FM_OPN *OPN, FM_CH *CH, int chnum)
{
	INT32 out = 0;
	UINT32 AM = OPN->LFO_AM >> CH->ams;
	unsigned int eg_out;

	if (CH->Muted)
		return;

	OPN->m2 = OPN->c1 = OPN->c2 = OPN->mem = 0;

	*CH->mem_connect = CH->mem_value;  /* restore delayed sample (MEM) value to m2 or c2 */

	eg_out = volume_calc(&CH->SLOT[SLOT1]);
	if( eg_out < ENV_QUIET )  /* SLOT 1 */
	{
		if (CH->FB < SIN_BITS)
			out = (CH->op1_out[0] + CH->op1_out[1]) << (FREQ_SH - CH->FB);

		out = op_calc1(CH->SLOT[SLOT1].phase, eg_out, out);
	}

	CH->op1_out[0] = CH->op1_out[1];
	CH->op1_out[1] = out;

	if( !CH->connect1 ){
		/* algorithm 5  */
		OPN->mem = OPN->c1 = OPN->c2 = out;
	}else{
		/* other algorithms */
		*CH->connect1 = out;
	}

	eg_out = volume_calc(&CH->SLOT[SLOT3]);
	if( eg_out < ENV_QUIET )    /* SLOT 3 */
		*CH->connect3 += op_calc(CH->SLOT[SLOT3].phase, eg_out, OPN->m2);

	eg_out = volume_calc(&CH->SLOT[SLOT2]);
	if( eg_out < ENV_QUIET )    /* SLOT 2 */
		*CH->connect2 += op_calc(CH->SLOT[SLOT2].phase, eg_out, OPN->c1);

	eg_out = volume_calc(&CH->SLOT[SLOT4]);
	if( eg_out < ENV_QUIET )    /* SLOT 4 */
		*CH->connect4 += op_calc(CH->SLOT[SLOT4].phase, eg_out, OPN->c2);

	/* store current MEM */
	CH->mem_value = OPN->mem;

	/* update phase counters AFTER output calculations */
	if (CH->pms)
	{
		/* 3-slot mode */
		if ((OPN->ST.mode & 0xC0) && (CH == &OPN->P_CH[2]))
		{
			/* keyscale code is not modified by LFO */
			UINT8 kc = CH->kcode;
			UINT32 pm = CH->pms + OPN->LFO_PM;
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT1], pm, kc, OPN->SL3.block_fnum[1]);
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT2], pm, kc, OPN->SL3.block_fnum[2]);
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT3], pm, kc, OPN->SL3.block_fnum[0]);
			update_phase_lfo_slot(OPN, &CH->SLOT[SLOT4], pm, kc, CH->block_fnum);
		}
		else
		{
			update_phase_lfo_channel(OPN, CH);
		}
	}
	else  /* no LFO phase modulation */
	{
		CH->SLOT[SLOT1].phase += CH->SLOT[SLOT1].Incr;
		CH->SLOT[SLOT2].phase += CH->SLOT[SLOT2].Incr;
		CH->SLOT[SLOT3].phase += CH->SLOT[SLOT3].Incr;
		CH->SLOT[SLOT4].phase += CH->SLOT[SLOT4].Incr;
	}
}